

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Exporter::ExportMeshes(glTF2Exporter *this)

{
  uint uVar1;
  Asset *pAVar2;
  aiMesh *paVar3;
  Mesh *pMVar4;
  pointer pPVar5;
  Skin *pSVar6;
  pointer ppMVar7;
  pointer puVar8;
  pointer paVar9;
  uint uVar10;
  vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *pvVar11;
  vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *pvVar12;
  void *data;
  element_type *peVar13;
  PrimitiveMode PVar14;
  ulong uVar15;
  size_t count;
  long lVar16;
  uint j;
  ulong uVar17;
  uint i;
  ulong uVar18;
  size_t j_1;
  ulong uVar19;
  aiVector3D *data_00;
  ulong uVar20;
  long lVar21;
  Ref<glTF2::Buffer> RVar22;
  Ref<glTF2::Skin> RVar23;
  Ref<glTF2::Mesh> RVar24;
  Ref<glTF2::Accessor> RVar25;
  Ref<glTF2::Node> RVar26;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  uint local_1a4;
  Ref<glTF2::Skin> local_1a0;
  vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *local_190;
  Ref<glTF2::Mesh> local_188;
  Ref<glTF2::Buffer> local_178;
  string name;
  string skinName;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  value_type local_f0;
  value_type local_e0;
  string meshId;
  string bufferIdPrefix;
  string bufferId;
  string fname;
  string local_50;
  
  std::__cxx11::string::string((string *)&fname,this->mFilename,(allocator *)&bufferIdPrefix);
  std::__cxx11::string::rfind((char *)&fname,0x594c20);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  pAVar2 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&skinName,"",(allocator *)&name);
  glTF2::Asset::FindUniqueID(&bufferId,pAVar2,&skinName,bufferIdPrefix._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&skinName);
  peVar13 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178.vector = (peVar13->mBodyBuffer).vector;
  local_178.index = (peVar13->mBodyBuffer).index;
  if (local_178.vector == (vector<glTF2::Buffer_*,_std::allocator<glTF2::Buffer_*>_> *)0x0) {
    RVar22 = glTF2::LazyDict<glTF2::Buffer>::Create(&peVar13->buffers,bufferId._M_dataplus._M_p);
    local_178.vector = RVar22.vector;
    local_178.index = RVar22.index;
  }
  uVar20 = (ulong)this->mScene->mNumMeshes;
  uVar17 = 0;
  do {
    uVar15 = uVar17;
    if (uVar20 == uVar15) break;
    paVar3 = this->mScene->mMeshes[uVar15];
    uVar17 = uVar15 + 1;
  } while ((paVar3->mBones == (aiBone **)0x0) || (paVar3->mNumBones == 0));
  local_1a0.vector = (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0;
  local_1a0.index = 0;
  pAVar2 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)&name,"skin",(allocator *)&meshId);
  glTF2::Asset::FindUniqueID(&skinName,pAVar2,&name,"skin");
  std::__cxx11::string::~string((string *)&name);
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (uVar15 < uVar20) {
    RVar23 = glTF2::LazyDict<glTF2::Skin>::Create
                       (&((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         skins,skinName._M_dataplus._M_p);
    pvVar11 = RVar23.vector;
    local_1a4 = RVar23.index;
    local_1a0.vector = pvVar11;
    local_1a0.index = local_1a4;
    std::__cxx11::string::_M_assign
              ((string *)
               &(pvVar11->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl
                .super__Vector_impl_data._M_start[RVar23._8_8_ & 0xffffffff]->name);
    local_190 = pvVar11;
  }
  else {
    local_1a4 = 0;
    local_190 = (vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> *)0x0;
  }
  uVar17 = 0;
  while( true ) {
    paVar9 = inverseBindMatricesData.
             super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (this->mScene->mNumMeshes <= uVar17) break;
    paVar3 = this->mScene->mMeshes[uVar17];
    std::__cxx11::string::string((string *)&name,(paVar3->mName).data,(allocator *)&meshId);
    glTF2::Asset::FindUniqueID
              (&meshId,(this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,&name,"mesh");
    RVar24 = glTF2::LazyDict<glTF2::Mesh>::Create
                       (&((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         meshes,meshId._M_dataplus._M_p);
    pvVar12 = RVar24.vector;
    uVar10 = RVar24.index;
    local_188.vector = pvVar12;
    local_188.index = uVar10;
    std::vector<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>::resize
              (&(pvVar12->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)._M_impl
                .super__Vector_impl_data._M_start[uVar10]->primitives,1);
    pMVar4 = (pvVar12->super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar10];
    pPVar5 = *(pointer *)
              ((long)&(pMVar4->primitives).
                      super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
                      ._M_impl + 8);
    std::__cxx11::string::_M_assign((string *)&(pMVar4->super_Object).name);
    uVar10 = paVar3->mMaterialIndex;
    pPVar5[-1].material.vector =
         &(((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          materials).mObjs;
    pPVar5[-1].material.index = uVar10;
    RVar25 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_178,(ulong)paVar3->mNumVertices,paVar3->mVertices,VEC3
                        ,VEC3,ComponentType_FLOAT,false);
    local_e0.vector = RVar25.vector;
    local_e0.index = RVar25.index;
    if (local_e0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back(&pPVar5[-1].attributes.position,&local_e0);
    }
    if (paVar3->mNormals == (aiVector3D *)0x0) {
      count = (size_t)paVar3->mNumVertices;
      data_00 = (aiVector3D *)0x0;
    }
    else {
      lVar21 = 0;
      uVar18 = 0;
      while( true ) {
        count = (size_t)paVar3->mNumVertices;
        data_00 = paVar3->mNormals;
        if (count <= uVar18) break;
        aiVector3t<float>::Normalize((aiVector3t<float> *)((long)&data_00->x + lVar21));
        uVar18 = uVar18 + 1;
        lVar21 = lVar21 + 0xc;
      }
    }
    RVar25 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&meshId,&local_178,count,data_00,VEC3,VEC3,ComponentType_FLOAT,false)
    ;
    local_f0.vector = RVar25.vector;
    local_f0.index = RVar25.index;
    if (local_f0.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
      push_back(&pPVar5[-1].attributes.normal,&local_f0);
    }
    for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
      uVar10 = paVar3->mNumVertices;
      if (uVar10 != 0 && paVar3->mTextureCoords[lVar21] != (aiVector3D *)0x0) {
        uVar1 = paVar3->mNumUVComponents[lVar21];
        if (1 < uVar1) {
          lVar16 = 4;
          for (uVar18 = 0; uVar18 < uVar10; uVar18 = uVar18 + 1) {
            *(float *)((long)&paVar3->mTextureCoords[lVar21]->x + lVar16) =
                 1.0 - *(float *)((long)&paVar3->mTextureCoords[lVar21]->x + lVar16);
            uVar10 = paVar3->mNumVertices;
            lVar16 = lVar16 + 0xc;
          }
          uVar1 = paVar3->mNumUVComponents[lVar21];
        }
        if (uVar1 != 0) {
          RVar25 = ExportData((this->mAsset).
                              super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &meshId,&local_178,(ulong)uVar10,paVar3->mTextureCoords[lVar21],VEC3,
                              (uVar1 != 2) + VEC2,ComponentType_FLOAT,false);
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)RVar25.vector;
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(indices.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish._4_4_,RVar25.index);
          if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
              indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
            std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>
            ::push_back(&pPVar5[-1].attributes.texcoord,(value_type *)&indices);
          }
        }
      }
    }
    for (uVar18 = 0; uVar10 = aiMesh::GetNumColorChannels(paVar3), uVar18 < uVar10;
        uVar18 = uVar18 + 1) {
      RVar25 = ExportData((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &meshId,&local_178,(ulong)paVar3->mNumVertices,paVar3->mColors[uVar18],
                          VEC4,VEC4,ComponentType_FLOAT,false);
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)RVar25.vector;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,RVar25.index);
      if ((vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
        std::vector<glTF2::Ref<glTF2::Accessor>,_std::allocator<glTF2::Ref<glTF2::Accessor>_>_>::
        push_back(&pPVar5[-1].attributes.color,(value_type *)&indices);
      }
    }
    if (paVar3->mNumFaces != 0) {
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar10 = paVar3->mFaces->mNumIndices;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&indices,(ulong)(paVar3->mNumFaces * uVar10));
      lVar21 = 0;
      for (uVar18 = 0; uVar18 < paVar3->mNumFaces; uVar18 = uVar18 + 1) {
        for (uVar19 = 0; uVar10 != uVar19; uVar19 = uVar19 + 1) {
          *(uint *)((long)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start + uVar19 * 4 + lVar21) =
               paVar3->mFaces[uVar18].mIndices[uVar19];
        }
        lVar21 = lVar21 + (ulong)uVar10 * 4;
      }
      RVar25 = ExportData((this->mAsset).
                          super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &meshId,&local_178,
                          (long)indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)indices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2,
                          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                          ComponentType_UNSIGNED_INT,true);
      pPVar5[-1].indices.vector = RVar25.vector;
      pPVar5[-1].indices.index = RVar25.index;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    PVar14 = (uint)(paVar3->mPrimitiveTypes != 2) * 3 + PrimitiveMode_LINES;
    if (paVar3->mPrimitiveTypes == 1) {
      PVar14 = PrimitiveMode_POINTS;
    }
    pPVar5[-1].mode = PVar14;
    if ((paVar3->mBones != (aiBone **)0x0) && (paVar3->mNumBones != 0)) {
      ExportSkin((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 paVar3,&local_188,&local_178,&local_1a0,&inverseBindMatricesData);
    }
    std::__cxx11::string::~string((string *)&meshId);
    std::__cxx11::string::~string((string *)&name);
    uVar17 = uVar17 + 1;
  }
  if (uVar15 < uVar20) {
    uVar17 = (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6;
    data = operator_new__(-(ulong)(uVar17 >> 0x3a != 0) |
                          (long)inverseBindMatricesData.
                                super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)inverseBindMatricesData.
                                super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
    for (uVar10 = 0; uVar20 = (ulong)uVar10, uVar20 < uVar17; uVar10 = uVar10 + 1) {
      CopyValue(paVar9 + uVar20,(mat4 *)(uVar20 * 0x40 + (long)data));
    }
    RVar25 = ExportData((this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&skinName,&local_178,uVar17,data,MAT4,MAT4,ComponentType_FLOAT,false)
    ;
    uVar17 = (ulong)local_1a4;
    if (RVar25.vector != (vector<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_> *)0x0) {
      pSVar6 = (local_190->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar17];
      (pSVar6->inverseBindMatrices).vector = RVar25.vector;
      (pSVar6->inverseBindMatrices).index = RVar25.index;
    }
    ((local_190->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
     super__Vector_impl_data._M_start[uVar17]->bindShapeMatrix).isPresent = true;
    pSVar6 = (local_190->super__Vector_base<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar17];
    (pSVar6->bindShapeMatrix).value[0] = 1.0;
    (pSVar6->bindShapeMatrix).value[1] = 0.0;
    (pSVar6->bindShapeMatrix).value[2] = 0.0;
    (pSVar6->bindShapeMatrix).value[3] = 0.0;
    (pSVar6->bindShapeMatrix).value[4] = 0.0;
    (pSVar6->bindShapeMatrix).value[5] = 1.0;
    (pSVar6->bindShapeMatrix).value[6] = 0.0;
    (pSVar6->bindShapeMatrix).value[7] = 0.0;
    (pSVar6->bindShapeMatrix).value[8] = 0.0;
    (pSVar6->bindShapeMatrix).value[9] = 0.0;
    (pSVar6->bindShapeMatrix).value[10] = 1.0;
    (pSVar6->bindShapeMatrix).value[0xb] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xc] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xd] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xe] = 0.0;
    (pSVar6->bindShapeMatrix).value[0xf] = 1.0;
    peVar13 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    meshId._M_dataplus._M_p = (pointer)&(peVar13->nodes).mObjs;
    meshId._M_string_length._0_4_ = 0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    for (uVar17 = 0;
        ppMVar7 = (peVar13->meshes).mObjs.
                  super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        uVar17 < ((ulong)((long)*(pointer *)
                                 ((long)&(peVar13->meshes).mObjs.
                                         super__Vector_base<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_>
                                         ._M_impl.super__Vector_impl_data + 8) - (long)ppMVar7) >> 3
                 & 0xffffffff); uVar17 = uVar17 + 1) {
      pMVar4 = ppMVar7[uVar17];
      lVar21 = *(long *)&(pMVar4->primitives).
                         super__Vector_base<glTF2::Mesh::Primitive,_std::allocator<glTF2::Mesh::Primitive>_>
      ;
      uVar10 = 0;
      do {
        if ((ulong)((long)*(pointer *)((long)&pMVar4->primitives + 8) - lVar21 >> 8) <=
            (ulong)uVar10) goto LAB_00373e7f;
        lVar16 = (ulong)uVar10 * 0x100;
        uVar10 = uVar10 + 1;
      } while (*(long *)(lVar21 + 0xb0 + lVar16) == *(long *)(lVar21 + 0xb8 + lVar16));
      std::__cxx11::string::string((string *)&name,(string *)((long)&pMVar4->super_Object + 0x10));
      std::__cxx11::string::string((string *)&local_50,(string *)&name);
      FindMeshNode((Ref<glTF2::Node> *)&meshId,(Ref<glTF2::Node> *)&indices,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      RVar26 = FindSkeletonRootJoint(&local_1a0);
      puVar8 = indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_188.vector = (vector<glTF2::Mesh_*,_std::allocator<glTF2::Mesh_*>_> *)RVar26.vector;
      local_188.index = RVar26.index;
      uVar20 = (ulong)indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish & 0xffffffff;
      std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::push_back
                ((vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> *)
                 (*(long *)(*(long *)indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + uVar20 * 8) + 0x118
                 ),(value_type *)&local_188);
      lVar21 = *(long *)(*(long *)puVar8 + uVar20 * 8);
      *(uint *)(lVar21 + 0x138) = local_1a0.index;
      *(vector<glTF2::Skin_*,_std::allocator<glTF2::Skin_*>_> **)(lVar21 + 0x130) = local_1a0.vector
      ;
      std::__cxx11::string::~string((string *)&name);
      peVar13 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00373e7f:
    }
    operator_delete__(data);
  }
  std::_Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::~_Vector_base
            (&inverseBindMatricesData.
              super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>);
  std::__cxx11::string::~string((string *)&skinName);
  std::__cxx11::string::~string((string *)&bufferId);
  std::__cxx11::string::~string((string *)&bufferIdPrefix);
  std::__cxx11::string::~string((string *)&fname);
  return;
}

Assistant:

void glTF2Exporter::ExportMeshes()
{
    typedef decltype(aiFace::mNumIndices) IndicesType;

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

        std::string name = aim->mName.C_Str();

        std::string meshId = mAsset->FindUniqueID(name, "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        m->name = name;

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
        // Normalize all normals as the validator can emit a warning otherwise
        if ( nullptr != aim->mNormals) {
            for ( auto i = 0u; i < aim->mNumVertices; ++i ) {
                aim->mNormals[ i ].Normalize();
            }
        }

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
        if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
			if (!aim->HasTextureCoords(i))
				continue;
			
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertex colors ****************/
		for (unsigned int indexColorChannel = 0; indexColorChannel < aim->GetNumColorChannels(); ++indexColorChannel) {
			Ref<Accessor> c = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mColors[indexColorChannel], AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT, false);
			if (c)
				p.attributes.color.push_back(c);
		}

		/*************** Vertices indices ****************/
		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = IndicesType(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, indices.size(), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_INT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

        /*************** Skins ****************/
        if(aim->HasBones()) {
            ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
        }
    }

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b,
                static_cast<unsigned int>(inverseBindMatricesData.size()),
            invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) {
            skinRef->inverseBindMatrices = invBindMatrixAccessor;
        }

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find nodes that contain a mesh with bones and add "skeletons" and "skin" attributes to those nodes.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        for (unsigned int meshIndex = 0; meshIndex < mAsset->meshes.Size(); ++meshIndex) {
            Ref<Mesh> mesh = mAsset->meshes.Get(meshIndex);
            bool hasBones = false;
            for (unsigned int i = 0; i < mesh->primitives.size(); ++i) {
                if (!mesh->primitives[i].attributes.weight.empty()) {
                    hasBones = true;
                    break;
                }
            }
            if (!hasBones) {
                continue;
            }
            std::string meshID = mesh->id;
            FindMeshNode(rootNode, meshNode, meshID);
            Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
            meshNode->skeletons.push_back(rootJoint);
            meshNode->skin = skinRef;
        }
        delete[] invBindMatrixData;
    }
}